

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * fts5ConfigGobbleWord(int *pRc,char *zIn,char **pzOut,int *pbQuoted)

{
  int iVar1;
  size_t sVar2;
  char *z;
  int ii;
  char *zOut;
  sqlite3_int64 nIn;
  char *zRet;
  int *pbQuoted_local;
  char **pzOut_local;
  char *zIn_local;
  int *pRc_local;
  
  nIn = 0;
  sVar2 = strlen(zIn);
  z = (char *)sqlite3_malloc64(sVar2 + 1);
  *pbQuoted = 0;
  *pzOut = (char *)0x0;
  if (z == (char *)0x0) {
    *pRc = 7;
  }
  else {
    memcpy(z,zIn,sVar2 + 1);
    iVar1 = fts5_isopenquote(*z);
    if (iVar1 == 0) {
      nIn = (sqlite3_int64)fts5ConfigSkipBareword(zIn);
      if ((char *)nIn != (char *)0x0) {
        z[nIn - (long)zIn] = '\0';
      }
    }
    else {
      iVar1 = fts5Dequote(z);
      nIn = (sqlite3_int64)(zIn + iVar1);
      *pbQuoted = 1;
    }
  }
  if (nIn == 0) {
    sqlite3_free(z);
  }
  else {
    *pzOut = z;
  }
  return (char *)nIn;
}

Assistant:

static const char *fts5ConfigGobbleWord(
  int *pRc,                       /* IN/OUT: Error code */
  const char *zIn,                /* Buffer to gobble string/bareword from */
  char **pzOut,                   /* OUT: malloc'd buffer containing str/bw */
  int *pbQuoted                   /* OUT: Set to true if dequoting required */
){
  const char *zRet = 0;

  sqlite3_int64 nIn = strlen(zIn);
  char *zOut = sqlite3_malloc64(nIn+1);

  assert( *pRc==SQLITE_OK );
  *pbQuoted = 0;
  *pzOut = 0;

  if( zOut==0 ){
    *pRc = SQLITE_NOMEM;
  }else{
    memcpy(zOut, zIn, (size_t)(nIn+1));
    if( fts5_isopenquote(zOut[0]) ){
      int ii = fts5Dequote(zOut);
      zRet = &zIn[ii];
      *pbQuoted = 1;
    }else{
      zRet = fts5ConfigSkipBareword(zIn);
      if( zRet ){
        zOut[zRet-zIn] = '\0';
      }
    }
  }

  if( zRet==0 ){
    sqlite3_free(zOut);
  }else{
    *pzOut = zOut;
  }

  return zRet;
}